

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_bKGD(ucvector *out,LodePNGInfo *info)

{
  uint uVar1;
  uint uVar2;
  uint extraout_EAX;
  uchar *data;
  uchar *puVar3;
  uchar uVar4;
  size_t sVar6;
  ulong uVar8;
  uchar uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  undefined2 uVar5;
  ulong uVar7;
  
  data = (uchar *)0x0;
  uVar2 = 0;
  switch((info->color).colortype) {
  case LCT_GREY:
  case LCT_GREY_ALPHA:
    uVar13 = info->background_r;
    uVar11 = 1;
    data = (uchar *)malloc(1);
    if (data != (uchar *)0x0) {
      *data = (uchar)(uVar13 >> 8);
      uVar11 = 2;
    }
    uVar2 = (uint)(data != (uchar *)0x0);
    uVar10 = 0;
    if ((uint)uVar11 <= uVar2 * 2) {
      uVar10 = uVar11 >> 1;
    }
    puVar3 = (uchar *)realloc(data,uVar10 + uVar11);
    if (puVar3 != (uchar *)0x0) {
      puVar3[uVar11 - 1] = (uchar)uVar13;
      data = puVar3;
      uVar2 = (uint)uVar11;
    }
    break;
  case LCT_RGB:
  case LCT_RGBA:
    uVar2 = info->background_r;
    uVar11 = 1;
    data = (uchar *)malloc(1);
    bVar14 = data != (uchar *)0x0;
    if (bVar14) {
      *data = (uchar)(uVar2 >> 8);
      uVar11 = 2;
    }
    uVar10 = (ulong)bVar14;
    uVar7 = 0;
    if ((uint)uVar11 <= (uint)bVar14 * 2) {
      uVar7 = uVar11 >> 1;
    }
    sVar6 = uVar7 + uVar11;
    puVar3 = (uchar *)realloc(data,sVar6);
    if (puVar3 == (uchar *)0x0) {
      uVar5 = (undefined2)info->background_g;
      uVar12 = uVar10 + 1;
      uVar11 = uVar10;
LAB_00113815:
      uVar9 = (uchar)((ushort)uVar5 >> 8);
      uVar4 = (uchar)uVar5;
      uVar7 = 0;
      if ((uint)uVar11 < (uint)((int)uVar10 * 2)) {
        uVar7 = uVar12 >> 1;
      }
      sVar6 = uVar7 + uVar12;
      puVar3 = (uchar *)realloc(data,sVar6);
      uVar8 = uVar11;
      if (puVar3 != (uchar *)0x0) goto LAB_0011385a;
    }
    else {
      puVar3[uVar11 - 1] = (uchar)uVar2;
      uVar5 = (undefined2)info->background_g;
      uVar9 = (uchar)(info->background_g >> 8);
      uVar12 = uVar11 + 1;
      uVar10 = sVar6;
      data = puVar3;
      uVar8 = uVar11;
      if (uVar7 == 0) goto LAB_00113815;
LAB_0011385a:
      uVar11 = uVar12;
      puVar3[uVar11 - 1] = uVar9;
      uVar4 = (uchar)info->background_g;
      uVar12 = uVar8 + 2;
      data = puVar3;
      uVar10 = sVar6;
    }
    puVar3 = data;
    sVar6 = uVar10;
    if ((uint)uVar11 < (uint)uVar10) {
LAB_001138af:
      puVar3[uVar12 - 1] = uVar4;
      uVar8 = uVar12 + 1;
      data = puVar3;
      uVar10 = sVar6;
      uVar11 = uVar12;
    }
    else {
      uVar7 = 0;
      if ((uint)uVar11 < (uint)uVar10 * 2) {
        uVar7 = uVar12 >> 1;
      }
      puVar3 = (uchar *)realloc(data,uVar7 + uVar12);
      uVar8 = uVar12;
      sVar6 = uVar7 + uVar12;
      if (puVar3 != (uchar *)0x0) goto LAB_001138af;
    }
    uVar9 = *(uchar *)((long)&info->background_b + 1);
    uVar13 = (uint)uVar10;
    puVar3 = data;
    if ((uint)uVar11 < uVar13) {
LAB_001138fd:
      uVar13 = (uint)uVar10;
      puVar3[uVar8 - 1] = uVar9;
      uVar11 = uVar8;
      data = puVar3;
      uVar8 = uVar8 + 1;
    }
    else {
      uVar10 = 0;
      if ((uint)uVar11 < uVar13 * 2) {
        uVar10 = uVar8 >> 1;
      }
      uVar10 = uVar10 + uVar8;
      puVar3 = (uchar *)realloc(data,uVar10);
      if (puVar3 != (uchar *)0x0) goto LAB_001138fd;
    }
    uVar1 = info->background_b;
    uVar2 = (uint)uVar11;
    puVar3 = data;
    if (uVar13 <= uVar2) {
      uVar11 = 0;
      if (uVar2 < uVar13 * 2) {
        uVar11 = uVar8 >> 1;
      }
      puVar3 = (uchar *)realloc(data,uVar11 + uVar8);
      if (puVar3 == (uchar *)0x0) break;
    }
    puVar3[uVar8 - 1] = (uchar)uVar1;
    data = puVar3;
    uVar2 = (uint)uVar8;
    break;
  case LCT_PALETTE:
    uVar13 = info->background_r;
    uVar2 = 1;
    data = (uchar *)malloc(1);
    if (data == (uchar *)0x0) {
      data = (uchar *)0x0;
      uVar2 = 0;
    }
    else {
      *data = (uchar)uVar13;
    }
  }
  uVar2 = lodepng_chunk_create(&out->data,&out->size,uVar2,"bKGD",data);
  if (uVar2 == 0) {
    out->allocsize = out->size;
  }
  free(data);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_bKGD(ucvector* out, const LodePNGInfo* info)
{
	unsigned error = 0;
	ucvector bKGD;
	ucvector_init(&bKGD);
	if (info->color.colortype == LCT_GREY || info->color.colortype == LCT_GREY_ALPHA)
	{
		ucvector_push_back(&bKGD, (unsigned char)(info->background_r >> 8));
		ucvector_push_back(&bKGD, (unsigned char)(info->background_r & 255));
	}
	else if (info->color.colortype == LCT_RGB || info->color.colortype == LCT_RGBA)
	{
		ucvector_push_back(&bKGD, (unsigned char)(info->background_r >> 8));
		ucvector_push_back(&bKGD, (unsigned char)(info->background_r & 255));
		ucvector_push_back(&bKGD, (unsigned char)(info->background_g >> 8));
		ucvector_push_back(&bKGD, (unsigned char)(info->background_g & 255));
		ucvector_push_back(&bKGD, (unsigned char)(info->background_b >> 8));
		ucvector_push_back(&bKGD, (unsigned char)(info->background_b & 255));
	}
	else if (info->color.colortype == LCT_PALETTE)
	{
		ucvector_push_back(&bKGD, (unsigned char)(info->background_r & 255)); /*palette index*/
	}

	error = addChunk(out, "bKGD", bKGD.data, bKGD.size);
	ucvector_cleanup(&bKGD);

	return error;
}